

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

bool __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TryReadEscape
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *startingLocation,
          EncodedCharPtr endOfSource,codepoint_t *outChar)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  byte *pbVar6;
  EncodedCharPtr puVar7;
  byte *pbVar8;
  EncodedCharPtr extraout_RDX;
  EncodedCharPtr extraout_RDX_00;
  EncodedCharPtr puVar9;
  codepoint_t cVar10;
  uint uVar11;
  int local_3c;
  uint local_38;
  undefined4 local_34;
  
  puVar9 = endOfSource;
  if (outChar == (codepoint_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x10c,"(outChar != nullptr)","outChar != nullptr");
    if (!bVar3) goto LAB_00f04674;
    *puVar5 = 0;
    puVar9 = extraout_RDX;
  }
  puVar7 = *startingLocation;
  if (endOfSource < puVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x10d,"(startingLocation <= endOfSource)","startingLocation <= endOfSource")
    ;
    if (!bVar3) goto LAB_00f04674;
    *puVar5 = 0;
    puVar7 = *startingLocation;
    puVar9 = extraout_RDX_00;
  }
  if ((puVar7 < endOfSource) && (*puVar7 == 'u')) {
    pbVar8 = puVar7 + 1;
    if ((pbVar8 < endOfSource) && ((*pbVar8 == 0x7b && (this->es6UnicodeMode != false)))) {
      pbVar8 = puVar7 + 2;
      local_38 = 0xffffffff;
      local_34 = (undefined4)CONCAT71((int7)((ulong)puVar9 >> 8),1);
    }
    else {
      local_38 = 4;
      local_34 = 0;
    }
    local_3c = 0;
    uVar11 = 0;
    if (endOfSource <= pbVar8) goto LAB_00f04662;
    cVar10 = 0;
    while( true ) {
      pbVar6 = pbVar8 + 1;
      bVar1 = *pbVar8;
      BVar4 = Js::NumberUtilities::FHexDigit((ushort)bVar1,&local_3c);
      if (BVar4 == 0) break;
      cVar10 = cVar10 * 0x10 + local_3c;
      if (0x10ffff < cVar10) goto LAB_00f0465f;
      uVar11 = uVar11 + 1;
      if ((local_38 <= uVar11) || (pbVar8 = pbVar6, endOfSource <= pbVar6)) break;
    }
    if (uVar11 != 0) {
      if (uVar11 == 4) {
        if ((char)local_34 != '\0') goto LAB_00f045ec;
LAB_00f0464d:
        *outChar = cVar10;
        *startingLocation = pbVar6;
        uVar11 = 1;
        goto LAB_00f04662;
      }
      if ((char)local_34 != '\0') {
LAB_00f045ec:
        if (this->es6UnicodeMode == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                             ,0x13c,"(expectCurly ? es6UnicodeMode : true)",
                             "expectCurly ? es6UnicodeMode : true");
          if (!bVar3) {
LAB_00f04674:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        if (bVar1 == 0x7d) goto LAB_00f0464d;
      }
    }
  }
LAB_00f0465f:
  uVar11 = 0;
LAB_00f04662:
  return SUB41(uVar11,0);
}

Assistant:

bool Scanner<EncodingPolicy>::TryReadEscape(EncodedCharPtr& startingLocation, EncodedCharPtr endOfSource, codepoint_t *outChar)
{
    Assert(outChar != nullptr);
    Assert(startingLocation <= endOfSource);

    EncodedCharPtr currentLocation = startingLocation;
    codepoint_t charToOutput = 0x0;

    // '\' is Assumed as there is only one caller
    // Read 'u' characters
    if (currentLocation >= endOfSource || this->ReadFirst(currentLocation, endOfSource) != 'u')
    {
        return false;
    }

    bool expectCurly = false;

    if (currentLocation < endOfSource && this->PeekFirst(currentLocation, endOfSource) == '{' && es6UnicodeMode)
    {
        expectCurly = true;
        // Move past the character
        this->ReadFirst(currentLocation, endOfSource);
    }

    uint i = 0;
    OLECHAR ch = 0;
    int hexValue = 0;
    uint maxHexDigits = (expectCurly ? MAXUINT32 : 4u);

    for(; i < maxHexDigits && currentLocation < endOfSource; i++)
    {
        if (!Js::NumberUtilities::FHexDigit(ch = this->ReadFirst(currentLocation, endOfSource), &hexValue))
        {
            break;
        }

        charToOutput = charToOutput * 0x10 + hexValue;

        if (charToOutput > 0x10FFFF)
        {
            return false;
        }
    }

    //At least 4 characters have to be read
    if (i == 0 || (i != 4 && !expectCurly))
    {
        return false;
    }

    Assert(expectCurly ? es6UnicodeMode : true);

    if (expectCurly && ch != '}')
    {
        return false;
    }

    *outChar = charToOutput;
    startingLocation = currentLocation;
    return true;
}